

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict unary_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  pos_t p;
  int iVar2;
  node_t_conflict pnVar3;
  node_t_conflict pnVar4;
  node_code_t nc;
  char *expected_name;
  pos_t p_00;
  node_code_t code;
  node_t_conflict r;
  pos_t pos;
  pos_t local_48;
  node_t_conflict local_38;
  
  pnVar3 = try_f(c2m_ctx,par_type_name);
  if (pnVar3 == &err_struct) {
    iVar2 = match(c2m_ctx,0x132,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      iVar2 = match(c2m_ctx,0x112,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
      if (iVar2 == 0) {
        iVar2 = match(c2m_ctx,0x10c,&pos,&code,(node_t_conflict *)0x0);
        if ((((iVar2 != 0) ||
             (iVar2 = match(c2m_ctx,0x10e,&pos,&code,(node_t_conflict *)0x0), iVar2 != 0)) ||
            (iVar2 = match(c2m_ctx,0x106,&pos,&code,(node_t_conflict *)0x0), iVar2 != 0)) ||
           ((iVar2 = match(c2m_ctx,0x2a,&pos,&code,(node_t_conflict *)0x0), iVar2 != 0 ||
            (iVar2 = match(c2m_ctx,0x26,&pos,&code,(node_t_conflict *)0x0), iVar2 != 0)))) {
          if (code == N_MUL) {
            code = N_DEREF;
          }
          else if (code == N_AND) {
            code = N_ADDR;
          }
          goto LAB_00164c7d;
        }
        ppVar1 = c2m_ctx->parse_ctx;
        iVar2 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,&r);
        pnVar3 = r;
        if (((iVar2 == 0) &&
            (iVar2 = match(c2m_ctx,0x100,(pos_t *)0x0,(node_code_t *)0x0,&r), pnVar3 = r, iVar2 == 0
            )) && ((iVar2 = match(c2m_ctx,0x101,(pos_t *)0x0,(node_code_t *)0x0,&r), pnVar3 = r,
                   iVar2 == 0 &&
                   (iVar2 = match(c2m_ctx,0x102,(pos_t *)0x0,(node_code_t *)0x0,&r), pnVar3 = r,
                   iVar2 == 0)))) {
          iVar2 = match(c2m_ctx,0x10a,&local_48,(node_code_t *)0x0,(node_t_conflict *)0x0);
          if (iVar2 == 0) {
            iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            if (iVar2 == 0) {
              iVar2 = match(c2m_ctx,0x115,&local_48,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar2 == 0) {
                return &err_struct;
              }
              iVar2 = match(c2m_ctx,0x28,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
              if (iVar2 == 0) {
                if (ppVar1->record_level != 0) {
                  return &err_struct;
                }
                iVar2 = 0x28;
              }
              else {
                r = assign_expr(c2m_ctx,no_err_p);
                if (r == &err_struct) {
                  return &err_struct;
                }
                iVar2 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
                if (iVar2 == 0) {
                  if (ppVar1->record_level != 0) {
                    return &err_struct;
                  }
                  iVar2 = 0x2c;
                }
                else {
                  local_38 = new_node(c2m_ctx,N_LIST);
                  pnVar3 = new_pos_node2(c2m_ctx,N_GENERIC,local_48,r,local_38);
                  do {
                    iVar2 = match(c2m_ctx,0x120,&local_48,(node_code_t *)0x0,(node_t_conflict *)0x0)
                    ;
                    if (iVar2 == 0) {
                      pnVar4 = type_name(c2m_ctx,no_err_p);
                      if (pnVar4 == &err_struct) {
                        return &err_struct;
                      }
                      r = pnVar4;
                      local_48 = get_node_pos(c2m_ctx,pnVar4);
                    }
                    else {
                      pnVar4 = new_node(c2m_ctx,N_IGNORE);
                    }
                    iVar2 = match(c2m_ctx,0x3a,(pos_t *)0x0,(node_code_t *)0x0,
                                  (node_t_conflict *)0x0);
                    if (iVar2 == 0) {
                      if (ppVar1->record_level != 0) {
                        return &err_struct;
                      }
                      iVar2 = 0x3a;
                      goto LAB_001650f1;
                    }
                    r = assign_expr(c2m_ctx,no_err_p);
                    if (r == &err_struct) {
                      return &err_struct;
                    }
                    pnVar4 = new_pos_node2(c2m_ctx,N_GENERIC_ASSOC,local_48,pnVar4,r);
                    op_append(c2m_ctx,local_38,pnVar4);
                    iVar2 = match(c2m_ctx,0x2c,(pos_t *)0x0,(node_code_t *)0x0,
                                  (node_t_conflict *)0x0);
                  } while (iVar2 != 0);
                  iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0)
                  ;
                  if (iVar2 != 0) goto LAB_00164df3;
                  if (ppVar1->record_level != 0) {
                    return &err_struct;
                  }
                  iVar2 = 0x29;
                }
              }
LAB_001650f1:
              expected_name = get_token_name(c2m_ctx,iVar2);
LAB_00164ed5:
              syntax_error(c2m_ctx,expected_name);
              return &err_struct;
            }
            if (*(short *)ppVar1->curr_token == 0x7b) {
              r = compound_stmt(c2m_ctx,no_err_p);
              if (r == &err_struct) {
                return &err_struct;
              }
              r = new_node1(c2m_ctx,N_STMTEXPR,r);
            }
            else {
              r = expr(c2m_ctx,no_err_p);
              if (r == &err_struct) {
                return &err_struct;
              }
            }
            iVar2 = match(c2m_ctx,0x29,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
            pnVar3 = r;
            if (iVar2 == 0) {
              return &err_struct;
            }
          }
          else {
            iVar2 = match(c2m_ctx,0x103,(pos_t *)0x0,(node_code_t *)0x0,&r);
            if (iVar2 == 0) {
              if (ppVar1->record_level != 0) {
                return &err_struct;
              }
              expected_name = "identifier";
              goto LAB_00164ed5;
            }
            pnVar3 = new_pos_node1(c2m_ctx,N_LABEL_ADDR,local_48,r);
          }
        }
LAB_00164df3:
        if (pnVar3 == &err_struct) {
          return &err_struct;
        }
        goto LAB_00164b91;
      }
      pnVar3 = try_f(c2m_ctx,par_type_name);
      if (pnVar3 == &err_struct) {
        pnVar3 = unary_expr(c2m_ctx,no_err_p);
        if (pnVar3 == &err_struct) {
          return &err_struct;
        }
        pnVar3 = new_node(c2m_ctx,N_IGNORE);
      }
      nc = N_ALIGNOF;
    }
    else {
      pnVar3 = try_f(c2m_ctx,par_type_name);
      if (pnVar3 == &err_struct) {
        code = N_EXPR_SIZEOF;
LAB_00164c7d:
        pnVar3 = unary_expr(c2m_ctx,no_err_p);
        nc = code;
        if (pnVar3 == &err_struct) {
          return &err_struct;
        }
      }
      else {
        nc = N_SIZEOF;
      }
    }
    p_00.lno = pos.lno;
    p_00.ln_pos = pos.ln_pos;
    p_00.fname = pos.fname;
    pnVar3 = new_pos_node1(c2m_ctx,nc,p_00,pnVar3);
  }
  else {
    iVar2 = match(c2m_ctx,0x7b,&pos,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      pnVar4 = unary_expr(c2m_ctx,no_err_p);
      if (pnVar4 == &err_struct) {
        return &err_struct;
      }
      pnVar3 = new_node2(c2m_ctx,N_CAST,pnVar3,pnVar4);
      return pnVar3;
    }
    pnVar4 = initializer_list(c2m_ctx,no_err_p);
    if (pnVar4 == &err_struct) {
      return &err_struct;
    }
    iVar2 = match(c2m_ctx,0x7d,(pos_t *)0x0,(node_code_t *)0x0,(node_t_conflict *)0x0);
    if (iVar2 == 0) {
      return &err_struct;
    }
    p.lno = pos.lno;
    p.ln_pos = pos.ln_pos;
    p.fname = pos.fname;
    pnVar3 = new_pos_node2(c2m_ctx,N_COMPOUND_LITERAL,p,pnVar3,pnVar4);
LAB_00164b91:
    pnVar3 = post_expr_part(c2m_ctx,no_err_p,pnVar3);
  }
  return pnVar3;
}

Assistant:

D (unary_expr) {
  node_t r, t;
  node_code_t code;
  pos_t pos;

  if ((r = TRY (par_type_name)) != err_node) {
    t = r;
    if (!MP ('{', pos)) {
      P (unary_expr);
      r = new_node2 (c2m_ctx, N_CAST, t, r);
    } else {
      P (initializer_list);
      if (!M ('}')) return err_node;
      r = new_pos_node2 (c2m_ctx, N_COMPOUND_LITERAL, pos, t, r);
      PA (post_expr_part, r);
    }
    return r;
  } else if (MP (T_SIZEOF, pos)) {
    if ((r = TRY (par_type_name)) != err_node) {
      r = new_pos_node1 (c2m_ctx, N_SIZEOF, pos, r);
      return r;
    }
    code = N_EXPR_SIZEOF;
  } else if (MP (T_ALIGNOF, pos)) {
    if ((r = TRY (par_type_name)) != err_node) {
      r = new_pos_node1 (c2m_ctx, N_ALIGNOF, pos, r);
    } else {
      P (unary_expr); /* error recovery */
      r = new_pos_node1 (c2m_ctx, N_ALIGNOF, pos, new_node (c2m_ctx, N_IGNORE));
    }
    return r;
  } else if (!MC (T_INCDEC, pos, code) && !MC (T_UNOP, pos, code) && !MC (T_ADDOP, pos, code)
             && !MC ('*', pos, code) && !MC ('&', pos, code)) {
    P (post_expr);
    return r;
  } else if (code == N_AND) {
    code = N_ADDR;
  } else if (code == N_MUL) {
    code = N_DEREF;
  }
  P (unary_expr);
  r = new_pos_node1 (c2m_ctx, code, pos, r);
  return r;
}